

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cn2Kernel.cpp
# Opt level: O2

void __thiscall
xmrig::Cn2Kernel::setArgs
          (Cn2Kernel *this,cl_mem scratchpads,cl_mem states,
          vector<_cl_mem_*,_std::allocator<_cl_mem_*>_> *branches,uint32_t threads)

{
  pointer pp_Var1;
  uint32_t index;
  uint32_t threads_local;
  cl_mem states_local;
  cl_mem scratchpads_local;
  
  threads_local = threads;
  states_local = states;
  scratchpads_local = scratchpads;
  OclKernel::setArg(&this->super_OclKernel,0,8,&scratchpads_local);
  OclKernel::setArg(&this->super_OclKernel,1,8,&states_local);
  OclKernel::setArg(&this->super_OclKernel,6,4,&threads_local);
  index = 2;
  while( true ) {
    pp_Var1 = (branches->super__Vector_base<_cl_mem_*,_std::allocator<_cl_mem_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(branches->super__Vector_base<_cl_mem_*,_std::allocator<_cl_mem_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pp_Var1 >> 3) <= (ulong)(index - 2))
    break;
    OclKernel::setArg(&this->super_OclKernel,index,8,pp_Var1 + (index - 2));
    index = index + 1;
  }
  return;
}

Assistant:

void xmrig::Cn2Kernel::setArgs(cl_mem scratchpads, cl_mem states, const std::vector<cl_mem> &branches, uint32_t threads)
{
    setArg(0, sizeof(cl_mem), &scratchpads);
    setArg(1, sizeof(cl_mem), &states);
    setArg(6, sizeof(uint32_t), &threads);

    for (uint32_t i = 0; i < branches.size(); ++i) {
        setArg(i + 2, sizeof(cl_mem), &branches[i]);
    }
}